

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprListCompare(ExprList *pA,ExprList *pB,int iTab)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  iVar2 = 0;
  if ((((pA != (ExprList *)0x0 || pB != (ExprList *)0x0) &&
       (iVar2 = 1, pA != (ExprList *)0x0 && pB != (ExprList *)0x0)) && (pA->nExpr == pB->nExpr)) &&
     (iVar2 = 0, 0 < pA->nExpr)) {
    lVar3 = 0x18;
    lVar4 = 0;
    do {
      if (*(char *)((long)pA->a + lVar3 + -8) == *(char *)((long)pB->a + lVar3 + -8)) {
        iVar1 = sqlite3ExprCompare((Parse *)0x0,*(Expr **)((long)(pA->a + -1) + lVar3),
                                   *(Expr **)((long)(pB->a + -1) + lVar3),iTab);
        bVar5 = iVar1 == 0;
        if (!bVar5) {
          iVar2 = iVar1;
        }
      }
      else {
        bVar5 = false;
        iVar2 = 1;
      }
      if (!bVar5) {
        return iVar2;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar4 < pA->nExpr);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprListCompare(const ExprList *pA, const ExprList *pB, int iTab){
  int i;
  if( pA==0 && pB==0 ) return 0;
  if( pA==0 || pB==0 ) return 1;
  if( pA->nExpr!=pB->nExpr ) return 1;
  for(i=0; i<pA->nExpr; i++){
    int res;
    Expr *pExprA = pA->a[i].pExpr;
    Expr *pExprB = pB->a[i].pExpr;
    if( pA->a[i].fg.sortFlags!=pB->a[i].fg.sortFlags ) return 1;
    if( (res = sqlite3ExprCompare(0, pExprA, pExprB, iTab)) ) return res;
  }
  return 0;
}